

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPrivate::_q_handleFieldObjectDestroyed(QWizardPrivate *this,QObject *object)

{
  QList<QWizardField> *this_00;
  QMap<QString,_int> *this_01;
  int iVar1;
  QMapData<std::map<QString,_int,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>_>
  *pQVar2;
  iterator abegin;
  iterator iVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  _Base_ptr *pp_Var6;
  int iVar7;
  long in_FS_OFFSET;
  int local_54;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->fields;
  abegin = QList<QWizardField>::begin(this_00);
  iVar3 = QList<QWizardField>::end(this_00);
  if (abegin.i != iVar3.i) {
    this_01 = &this->fieldIndexMap;
    iVar7 = -1;
    do {
      if ((abegin.i)->object == object) {
        local_50.d.d = (Data *)CONCAT44(local_50.d.d._4_4_,0xffffffff);
        pQVar2 = (this_01->d).d.ptr;
        if (pQVar2 == (QMapData<std::map<QString,_int,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>_>
                       *)0x0) {
          iVar7 = -1;
        }
        else {
          cVar4 = std::
                  _Rb_tree<QString,_std::pair<const_QString,_int>,_std::_Select1st<std::pair<const_QString,_int>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>
                  ::find(&(pQVar2->m)._M_t,&(abegin.i)->name);
          pp_Var6 = &cVar4._M_node[1]._M_right;
          if ((_Rb_tree_header *)cVar4._M_node ==
              &(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
            pp_Var6 = (_Base_ptr *)&local_50;
          }
          iVar7 = *(int *)pp_Var6;
        }
        QMap<QString,_int>::remove(this_01,(char *)&(abegin.i)->name);
        abegin = QList<QWizardField>::erase(this_00,abegin.i,abegin.i + 1);
      }
      else {
        abegin.i = abegin.i + 1;
      }
      iVar3 = QList<QWizardField>::end(this_00);
    } while (abegin.i != iVar3.i);
    if (iVar7 != -1) {
      QMap<QString,_int>::detach(this_01);
      p_Var5 = *(_Base_ptr *)
                ((long)&(((this->fieldIndexMap).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                        _M_header + 0x10);
      QMap<QString,_int>::detach(this_01);
      if ((_Rb_tree_header *)p_Var5 !=
          &(((this->fieldIndexMap).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
        do {
          iVar1 = *(int *)&p_Var5[1]._M_right;
          if (iVar7 < iVar1) {
            local_50.d.d = *(Data **)(p_Var5 + 1);
            local_50.d.ptr = (char16_t *)p_Var5[1]._M_parent;
            local_50.d.size = (qsizetype)p_Var5[1]._M_left;
            if ((_Base_ptr)local_50.d.d != (_Base_ptr)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&((_Base_ptr)local_50.d.d)->_M_color)->_q_value).
              super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&((_Base_ptr)local_50.d.d)->_M_color)->_q_value).
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_54 = iVar1 + -1;
            QMap<QString,_int>::insert(this_01,&local_50,&local_54);
            if ((_Base_ptr)local_50.d.d != (_Base_ptr)0x0) {
              LOCK();
              ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          QMap<QString,_int>::detach(this_01);
        } while ((_Rb_tree_header *)p_Var5 !=
                 &(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::_q_handleFieldObjectDestroyed(QObject *object)
{
    int destroyed_index = -1;
    QList<QWizardField>::iterator it = fields.begin();
    while (it != fields.end()) {
        const QWizardField &field = *it;
        if (field.object == object) {
            destroyed_index = fieldIndexMap.value(field.name, -1);
            fieldIndexMap.remove(field.name);
            it = fields.erase(it);
        } else {
            ++it;
        }
    }
    if (destroyed_index != -1) {
        QMap<QString, int>::iterator it2 = fieldIndexMap.begin();
        while (it2 != fieldIndexMap.end()) {
            int index = it2.value();
            if (index > destroyed_index) {
                QString field_name = it2.key();
                fieldIndexMap.insert(field_name, index-1);
            }
            ++it2;
        }
    }
}